

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void sdf_tools::exportVectorTypes(module *m)

{
  initializer_list<pybind11::detail::field_descriptor> __l;
  initializer_list<pybind11::detail::field_descriptor> __l_00;
  initializer_list<pybind11::detail::field_descriptor> __l_01;
  undefined8 *in_RDI;
  factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_sdf_tools_bindings_types_cpp:86:23),_pybind11::detail::void_type_(*)(),_sdf_tools::int3_(pybind11::list),_pybind11::detail::void_type_()>
  *in_stack_fffffffffffff908;
  field_descriptor *in_stack_fffffffffffff910;
  constructor<float,_float> *in_stack_fffffffffffff918;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  *in_stack_fffffffffffff920;
  constructor<int,_int,_int> *in_stack_fffffffffffff928;
  any_container<pybind11::detail::field_descriptor> *in_stack_fffffffffffff930;
  allocator_type *in_stack_fffffffffffff938;
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
  *in_stack_fffffffffffff940;
  iterator in_stack_fffffffffffff948;
  offset_in_real2_to_float in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  class_<sdf_tools::int3> *in_stack_fffffffffffff960;
  type *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  class_<sdf_tools::int3> *in_stack_fffffffffffff980;
  class_<sdf_tools::real2> *in_stack_fffffffffffff988;
  handle in_stack_fffffffffffff990;
  class_<sdf_tools::int3> *in_stack_fffffffffffff998;
  handle in_stack_fffffffffffff9a0;
  char **local_5f8;
  char **local_540;
  char **local_4a0;
  char *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  char *local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  char *local_360;
  undefined8 local_358;
  undefined8 local_350;
  char **local_320;
  undefined8 local_318;
  arg local_2d0;
  char *local_2c0;
  undefined1 local_2b8;
  arg local_2b0;
  char *local_2a0;
  undefined1 local_298;
  arg local_290;
  char *local_280;
  undefined1 local_278;
  undefined8 local_268;
  char **local_250;
  char *local_248;
  undefined8 local_240;
  undefined8 local_238;
  char *local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  char *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  char **local_188;
  undefined8 local_180;
  arg local_138;
  char *local_128;
  undefined1 local_120;
  arg local_118;
  char *local_108;
  undefined1 local_100;
  undefined8 local_f0;
  char **local_d0;
  char *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char **local_48;
  undefined8 local_40;
  undefined8 *local_8;
  
  local_d0 = &local_c8;
  local_c8 = "x";
  local_c0 = 0;
  local_b8 = 4;
  local_8 = in_RDI;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_d0 = &local_88;
  local_88 = "y";
  local_80 = 4;
  local_78 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_48 = &local_c8;
  local_40 = 2;
  std::allocator<pybind11::detail::field_descriptor>::allocator
            ((allocator<pybind11::detail::field_descriptor> *)0x189ba6);
  __l._M_len = in_stack_fffffffffffff950;
  __l._M_array = in_stack_fffffffffffff948;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(in_stack_fffffffffffff940,__l,in_stack_fffffffffffff938);
  pybind11::detail::any_container<pybind11::detail::field_descriptor>::any_container
            ((any_container<pybind11::detail::field_descriptor> *)in_stack_fffffffffffff910,
             (vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
              *)in_stack_fffffffffffff908);
  pybind11::detail::npy_format_descriptor<sdf_tools::real2,_void>::register_dtype
            (in_stack_fffffffffffff930);
  pybind11::detail::any_container<pybind11::detail::field_descriptor>::~any_container
            ((any_container<pybind11::detail::field_descriptor> *)0x189c00);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(in_stack_fffffffffffff920);
  std::allocator<pybind11::detail::field_descriptor>::~allocator
            ((allocator<pybind11::detail::field_descriptor> *)0x189c1a);
  local_4a0 = (char **)&local_48;
  do {
    local_4a0 = local_4a0 + -8;
    pybind11::detail::field_descriptor::~field_descriptor(in_stack_fffffffffffff910);
  } while (local_4a0 != &local_c8);
  local_f0 = *local_8;
  pybind11::class_<sdf_tools::real2>::class_<>
            (in_stack_fffffffffffff988,in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff980);
  pybind11::init<float,float>();
  local_118 = pybind11::literals::operator____a
                        ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  local_108 = local_118.name;
  local_100 = local_118._8_1_;
  local_138 = pybind11::literals::operator____a
                        ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  local_128 = local_138.name;
  local_120 = local_138._8_1_;
  pybind11::class_<sdf_tools::real2>::def<float,float,pybind11::arg,pybind11::arg>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (arg *)in_stack_fffffffffffff910,(arg *)in_stack_fffffffffffff908);
  pybind11::
  init<sdf_tools::exportVectorTypes(pybind11::module_&)::__0,pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::__0,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::tuple),pybind11::detail::void_type()>>
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::real2>::
  def<sdf_tools::exportVectorTypes(pybind11::module_&)::__0,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::tuple),pybind11::detail::void_type()>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff910,
             (factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_sdf_tools_bindings_types_cpp:19:23),_pybind11::detail::void_type_(*)(),_sdf_tools::real2_(pybind11::tuple),_pybind11::detail::void_type_()>
              *)in_stack_fffffffffffff908);
  pybind11::
  init<sdf_tools::exportVectorTypes(pybind11::module_&)::__1,pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::__1,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::list),pybind11::detail::void_type()>>
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::real2>::
  def<sdf_tools::exportVectorTypes(pybind11::module_&)::__1,pybind11::detail::void_type(*)(),sdf_tools::real2(pybind11::list),pybind11::detail::void_type()>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff910,
             (factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_sdf_tools_bindings_types_cpp:24:23),_pybind11::detail::void_type_(*)(),_sdf_tools::real2_(pybind11::list),_pybind11::detail::void_type_()>
              *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::real2>::def_readwrite<sdf_tools::real2,float>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::real2>::def_readwrite<sdf_tools::real2,float>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::real2>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__2>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::real2>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__3>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::real2>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__4>
            ((class_<sdf_tools::real2> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::real2>::~class_((class_<sdf_tools::real2> *)0x189ead);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::real2>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::real2>();
  local_250 = &local_248;
  local_248 = "x";
  local_240 = 0;
  local_238 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_250 = &local_208;
  local_208 = "y";
  local_200 = 4;
  local_1f8 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_250 = &local_1c8;
  local_1c8 = "z";
  local_1c0 = 8;
  local_1b8 = 4;
  pybind11::format_descriptor<float,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<float,_void>::dtype();
  local_188 = &local_248;
  local_180 = 3;
  std::allocator<pybind11::detail::field_descriptor>::allocator
            ((allocator<pybind11::detail::field_descriptor> *)0x18a017);
  __l_00._M_len = in_stack_fffffffffffff950;
  __l_00._M_array = in_stack_fffffffffffff948;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(in_stack_fffffffffffff940,__l_00,in_stack_fffffffffffff938);
  pybind11::detail::any_container<pybind11::detail::field_descriptor>::any_container
            ((any_container<pybind11::detail::field_descriptor> *)in_stack_fffffffffffff910,
             (vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
              *)in_stack_fffffffffffff908);
  pybind11::detail::npy_format_descriptor<sdf_tools::real3,_void>::register_dtype
            (in_stack_fffffffffffff930);
  pybind11::detail::any_container<pybind11::detail::field_descriptor>::~any_container
            ((any_container<pybind11::detail::field_descriptor> *)0x18a071);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(in_stack_fffffffffffff920);
  std::allocator<pybind11::detail::field_descriptor>::~allocator
            ((allocator<pybind11::detail::field_descriptor> *)0x18a08b);
  local_540 = (char **)&local_188;
  do {
    local_540 = local_540 + -8;
    pybind11::detail::field_descriptor::~field_descriptor(in_stack_fffffffffffff910);
  } while (local_540 != &local_248);
  local_268 = *local_8;
  pybind11::class_<sdf_tools::real3>::class_<>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff998,in_stack_fffffffffffff9a0,
             (char *)in_stack_fffffffffffff990.m_ptr);
  pybind11::init<float,float,float>();
  local_290 = pybind11::literals::operator____a
                        ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  local_280 = local_290.name;
  local_278 = local_290._8_1_;
  local_2b0 = pybind11::literals::operator____a
                        ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  local_2a0 = local_2b0.name;
  local_298 = local_2b0._8_1_;
  local_2d0 = pybind11::literals::operator____a
                        ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  local_2c0 = local_2d0.name;
  local_2b8 = local_2d0._8_1_;
  pybind11::class_<sdf_tools::real3>::
  def<float,float,float,pybind11::arg,pybind11::arg,pybind11::arg>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff930,
             (constructor<float,_float,_float> *)in_stack_fffffffffffff928,
             (arg *)in_stack_fffffffffffff920,(arg *)in_stack_fffffffffffff918,
             (arg *)in_stack_fffffffffffff910);
  pybind11::
  init<sdf_tools::exportVectorTypes(pybind11::module_&)::__5,pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::__5,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::tuple),pybind11::detail::void_type()>>
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::real3>::
  def<sdf_tools::exportVectorTypes(pybind11::module_&)::__5,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::tuple),pybind11::detail::void_type()>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff910,
             (factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_sdf_tools_bindings_types_cpp:50:23),_pybind11::detail::void_type_(*)(),_sdf_tools::real3_(pybind11::tuple),_pybind11::detail::void_type_()>
              *)in_stack_fffffffffffff908);
  pybind11::
  init<sdf_tools::exportVectorTypes(pybind11::module_&)::__6,pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::__6,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::list),pybind11::detail::void_type()>>
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::real3>::
  def<sdf_tools::exportVectorTypes(pybind11::module_&)::__6,pybind11::detail::void_type(*)(),sdf_tools::real3(pybind11::list),pybind11::detail::void_type()>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff910,
             (factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_sdf_tools_bindings_types_cpp:55:23),_pybind11::detail::void_type_(*)(),_sdf_tools::real3_(pybind11::list),_pybind11::detail::void_type_()>
              *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::real3>::def_readwrite<sdf_tools::real3,float>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::real3>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__7>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::real3>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__8>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::real3>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__9>
            ((class_<sdf_tools::real3> *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::real3>::~class_((class_<sdf_tools::real3> *)0x18a3aa);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::real3>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::real3>();
  local_3e0 = "x";
  local_3d8 = 0;
  local_3d0 = 4;
  pybind11::format_descriptor<int,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_3a0 = "y";
  local_398 = 4;
  local_390 = 4;
  pybind11::format_descriptor<int,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_360 = "z";
  local_358 = 8;
  local_350 = 4;
  pybind11::format_descriptor<int,void>::format_abi_cxx11_();
  pybind11::detail::npy_format_descriptor<int,_void>::dtype();
  local_320 = &local_3e0;
  local_318 = 3;
  std::allocator<pybind11::detail::field_descriptor>::allocator
            ((allocator<pybind11::detail::field_descriptor> *)0x18a514);
  __l_01._M_len = in_stack_fffffffffffff950;
  __l_01._M_array = in_stack_fffffffffffff948;
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  vector(in_stack_fffffffffffff940,__l_01,in_stack_fffffffffffff938);
  pybind11::detail::any_container<pybind11::detail::field_descriptor>::any_container
            ((any_container<pybind11::detail::field_descriptor> *)in_stack_fffffffffffff910,
             (vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>
              *)in_stack_fffffffffffff908);
  pybind11::detail::npy_format_descriptor<sdf_tools::int3,_void>::register_dtype
            (in_stack_fffffffffffff930);
  pybind11::detail::any_container<pybind11::detail::field_descriptor>::~any_container
            ((any_container<pybind11::detail::field_descriptor> *)0x18a56e);
  std::
  vector<pybind11::detail::field_descriptor,_std::allocator<pybind11::detail::field_descriptor>_>::
  ~vector(in_stack_fffffffffffff920);
  std::allocator<pybind11::detail::field_descriptor>::~allocator
            ((allocator<pybind11::detail::field_descriptor> *)0x18a588);
  local_5f8 = (char **)&local_320;
  do {
    local_5f8 = local_5f8 + -8;
    pybind11::detail::field_descriptor::~field_descriptor(in_stack_fffffffffffff910);
  } while (local_5f8 != &local_3e0);
  pybind11::class_<sdf_tools::int3>::class_<>
            (in_stack_fffffffffffff998,in_stack_fffffffffffff9a0,
             (char *)in_stack_fffffffffffff990.m_ptr);
  pybind11::init<int,int,int>();
  pybind11::literals::operator____a
            ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  pybind11::literals::operator____a
            ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  pybind11::literals::operator____a
            ((char *)in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::int3>::def<int,int,int,pybind11::arg,pybind11::arg,pybind11::arg>
            ((class_<sdf_tools::int3> *)in_stack_fffffffffffff930,in_stack_fffffffffffff928,
             (arg *)in_stack_fffffffffffff920,(arg *)in_stack_fffffffffffff918,
             (arg *)in_stack_fffffffffffff910);
  pybind11::
  init<sdf_tools::exportVectorTypes(pybind11::module_&)::__10,pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::__10,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::tuple),pybind11::detail::void_type()>>
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::int3>::
  def<sdf_tools::exportVectorTypes(pybind11::module_&)::__10,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::tuple),pybind11::detail::void_type()>
            ((class_<sdf_tools::int3> *)in_stack_fffffffffffff910,
             (factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_amlucas[P]sdfTools_src_sdf_tools_bindings_types_cpp:82:23),_pybind11::detail::void_type_(*)(),_sdf_tools::int3_(pybind11::tuple),_pybind11::detail::void_type_()>
              *)in_stack_fffffffffffff908);
  pybind11::
  init<sdf_tools::exportVectorTypes(pybind11::module_&)::__11,pybind11::detail::initimpl::factory<sdf_tools::exportVectorTypes(pybind11::module_&)::__11,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::list),pybind11::detail::void_type()>>
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::int3>::
  def<sdf_tools::exportVectorTypes(pybind11::module_&)::__11,pybind11::detail::void_type(*)(),sdf_tools::int3(pybind11::list),pybind11::detail::void_type()>
            ((class_<sdf_tools::int3> *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::int3>::def_readwrite<sdf_tools::int3,int>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  pybind11::class_<sdf_tools::int3>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__12>
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,(type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::int3>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__13>
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,(type *)in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::int3>::def<sdf_tools::exportVectorTypes(pybind11::module_&)::__14>
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  pybind11::class_<sdf_tools::int3>::~class_((class_<sdf_tools::int3> *)0x18a8a7);
  pybind11::implicitly_convertible<pybind11::tuple,sdf_tools::int3>();
  pybind11::implicitly_convertible<pybind11::list,sdf_tools::int3>();
  return;
}

Assistant:

void exportVectorTypes(py::module &m)
{
    PYBIND11_NUMPY_DTYPE(real2, x, y);
    py::class_<real2>(m, "real2")
        .def(py::init<real, real>(), "x"_a, "y"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 2)
                              throw std::runtime_error("Should have length 2.");
                          return real2{t[0].cast<real>(), t[1].cast<real>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 2)
                              throw std::runtime_error("Should have length 2.");
                          return real2{t[0].cast<real>(), t[1].cast<real>()};
                      }))
        .def_readwrite("x", &real2::x)
        .def_readwrite("y", &real2::y)
        .def("__getitem__",
             [](const real2 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 throw py::index_error();
                 return 0._r;
             })
        .def("__str__", [](const real2 &v) { return "({}, {})"_s.format(v.x, v.y); })
        .def("__repr__",
             [](const real2 &v) { return "real2({}, {})"_s.format(v.x, v.y); });

    py::implicitly_convertible<py::tuple, real2>();
    py::implicitly_convertible<py::list, real2>();



    PYBIND11_NUMPY_DTYPE(real3, x, y, z);
    py::class_<real3>(m, "real3")
        .def(py::init<real, real, real>(), "x"_a, "y"_a, "z"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 3)
                              throw std::runtime_error("Should have length 3.");
                          return real3{t[0].cast<real>(), t[1].cast<real>(), t[2].cast<real>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 3)
                              throw std::runtime_error("Should have length 3.");
                          return real3{t[0].cast<real>(), t[1].cast<real>(), t[2].cast<real>()};
                      }))
        .def_readwrite("x", &real3::x)
        .def_readwrite("y", &real3::y)
        .def_readwrite("z", &real3::z)
        .def("__getitem__",
             [](const real3 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 if (i == 2) return v.z;
                 throw py::index_error();
                 return 0._r;
             })
        .def("__str__", [](const real3 &v) { return "({}, {}, {})"_s.format(v.x, v.y, v.z); })
        .def("__repr__",
             [](const real3 &v) { return "real3({}, {}, {})"_s.format(v.x, v.y, v.z); });

    py::implicitly_convertible<py::tuple, real3>();
    py::implicitly_convertible<py::list, real3>();


    PYBIND11_NUMPY_DTYPE(int3, x, y, z);
    py::class_<int3>(m, "int3")
        .def(py::init<int, int, int>(), "x"_a, "y"_a, "z"_a)
        .def(py::init([](py::tuple t) {
                          if (py::len(t) != 3) throw std::runtime_error("Should have length 3.");
                          return int3{t[0].cast<int>(), t[1].cast<int>(), t[2].cast<int>()};
                      }))
        .def(py::init([](py::list t) {
                          if (py::len(t) != 3) throw std::runtime_error("Should have length 3.");
                          return int3{t[0].cast<int>(), t[1].cast<int>(), t[2].cast<int>()};
                      }))
        .def_readwrite("x", &int3::x)
        .def_readwrite("y", &int3::y)
        .def_readwrite("z", &int3::z)
        .def("__getitem__",
             [](const int3 &v, size_t i) {
                 if (i == 0) return v.x;
                 if (i == 1) return v.y;
                 if (i == 2) return v.z;
                 throw py::index_error();
                 return 0;
             })
        .def("__str__", [](const int3 &v) { return "({}, {}, {})"_s.format(v.x, v.y, v.z); })
        .def("__repr__",
             [](const int3 &v) { return "int3({}, {}, {})"_s.format(v.x, v.y, v.z); });

    py::implicitly_convertible<py::tuple, int3>();
    py::implicitly_convertible<py::list, int3>();
}